

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

void __thiscall QTextStream::setGenerateByteOrderMark(QTextStream *this,bool generate)

{
  QTextStreamPrivate *pQVar1;
  long in_FS_OFFSET;
  State local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((pQVar1->hasWrittenData == false) && (pQVar1->generateBOM != generate)) {
    pQVar1->generateBOM = generate;
    local_50._4_8_ = 0;
    local_50._12_8_ = 0;
    local_50.invalidChars._4_4_ = 0;
    local_50.field_4.state_data[0] = 0;
    local_50.field_4.state_data[1] = 0;
    local_50.field_4.state_data[2] = 0;
    local_50.field_4.state_data[3] = 0;
    local_50.clearFn = (ClearDataFn)0x0;
    (pQVar1->fromUtf16).super_QStringConverter.iface =
         QStringConverter::encodingInterfaces + pQVar1->encoding;
    local_50.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)((uint)generate << 2);
    QStringConverterBase::State::clear
              ((State *)((long)&(pQVar1->fromUtf16).super_QStringConverter + 8));
    (((State *)((long)&(pQVar1->fromUtf16).super_QStringConverter + 8))->flags).
    super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag> =
         (QFlagsStorage<QStringConverterBase::Flag>)((uint)generate << 2);
    *(qsizetype *)((long)&(pQVar1->fromUtf16).super_QStringConverter + 0x10) = 0;
    *(qsizetype *)((long)&(pQVar1->fromUtf16).super_QStringConverter + 0x18) = 0;
    ((anon_union_16_2_cfafc8b3_for_State_4 *)
    ((long)&(pQVar1->fromUtf16).super_QStringConverter + 0x20))->d[0] =
         (void *)CONCAT44(local_50.field_4.state_data[1],local_50.field_4.state_data[0]);
    *(ulong *)((long)&(pQVar1->fromUtf16).super_QStringConverter + 0x28) =
         CONCAT44(local_50.field_4.state_data[3],local_50.field_4.state_data[2]);
    *(ClearDataFn *)((long)&(pQVar1->fromUtf16).super_QStringConverter + 0x30) = local_50.clearFn;
    local_50.clearFn = (ClearDataFn)0x0;
    QStringConverterBase::State::clear(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStream::setGenerateByteOrderMark(bool generate)
{
    Q_D(QTextStream);
    if (d->hasWrittenData || d->generateBOM == generate)
        return;

    d->generateBOM = generate;
    d->fromUtf16 = QStringEncoder(d->encoding, generate ? QStringConverter::Flag::WriteBom : QStringConverter::Flag::Default);
}